

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVarLengthArray<QGridLayoutSizeTriple,_256LL>::QVarLengthArray
          (QVarLengthArray<QGridLayoutSizeTriple,_256LL> *this,qsizetype asize)

{
  QGridLayoutSizeTriple *__first;
  
  (this->super_QVLABase<QGridLayoutSizeTriple>).super_QVLABaseBase.a = 0x100;
  (this->super_QVLABase<QGridLayoutSizeTriple>).super_QVLABaseBase.s = 0;
  __first = (QGridLayoutSizeTriple *)&this->super_QVLAStorage<24UL,_4UL,_256LL>;
  (this->super_QVLABase<QGridLayoutSizeTriple>).super_QVLABaseBase.ptr = __first;
  if (0x100 < asize) {
    (this->super_QVLABase<QGridLayoutSizeTriple>).super_QVLABaseBase.a = asize;
    __first = (QGridLayoutSizeTriple *)QtPrivate::fittedMalloc(0,(qsizetype *)this,0x18,0);
    (this->super_QVLABase<QGridLayoutSizeTriple>).super_QVLABaseBase.ptr = __first;
  }
  std::__uninitialized_default_novalue_n_1<false>::
  __uninit_default_novalue_n<QGridLayoutSizeTriple*,long_long>(__first,asize);
  (this->super_QVLABase<QGridLayoutSizeTriple>).super_QVLABaseBase.s = asize;
  return;
}

Assistant:

Q_INLINE_TEMPLATE QVarLengthArray<T, Prealloc>::QVarLengthArray(qsizetype asize)
    : QVarLengthArray()
{
    Q_ASSERT_X(asize >= 0, "QVarLengthArray::QVarLengthArray(qsizetype)",
               "Size must be greater than or equal to 0.");

    // historically, this ctor worked for non-copyable/non-movable T, so keep it working, why not?
    // resize(asize) // this requires a movable or copyable T, can't use, need to do it by hand

    if (asize > Prealloc) {
        this->a = asize;
        this->ptr = QtPrivate::fittedMalloc(0, &this->a, sizeof(T));
        Q_CHECK_PTR(this->ptr);
    }
    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_default_construct_n(data(), asize);
    this->s = asize;
}